

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_VRR_Algorithm_Base.cpp
# Opt level: O2

StringSet * __thiscall
OSTEI_VRR_Algorithm_Base::GenerateVarReq_abi_cxx11_
          (StringSet *__return_storage_ptr__,OSTEI_VRR_Algorithm_Base *this,QAM *am,
          RRStepType rrstep)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  allocator local_261;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  QAMList amreq;
  undefined1 local_228 [48];
  undefined1 local_1f8 [48];
  undefined1 local_1c8 [48];
  undefined1 local_198 [48];
  undefined1 local_168 [48];
  undefined1 local_138 [48];
  undefined1 local_108 [48];
  undefined1 local_d8 [48];
  undefined1 local_a8 [48];
  undefined1 local_78 [48];
  undefined1 local_48 [48];
  
  QAM::QAM((QAM *)local_48,am);
  GenerateAMReq(&amreq,(OSTEI_VRR_Algorithm_Base *)am,(QAM *)local_48,rrstep,true);
  std::__cxx11::string::~string((string *)(local_48 + 0x10));
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  if (rrstep < K) {
    QAM::QAM((QAM *)local_78,
             amreq.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.super__Vector_impl_data.
             _M_start);
    bVar2 = ValidQAM((QAM *)local_78);
    std::__cxx11::string::~string((string *)(local_78 + 0x10));
    if (bVar2) {
      if (rrstep == I) {
        std::__cxx11::string::string((string *)&local_260,"P_PA",&local_261);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)__return_storage_ptr__,&local_260);
      }
      else {
        std::__cxx11::string::string((string *)&local_260,"P_PB",&local_261);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)__return_storage_ptr__,&local_260);
      }
      std::__cxx11::string::~string((string *)&local_260);
      std::__cxx11::string::string((string *)&local_260,"aop_PQ",&local_261);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)__return_storage_ptr__,&local_260);
      std::__cxx11::string::~string((string *)&local_260);
    }
    QAM::QAM((QAM *)local_198,
             amreq.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.super__Vector_impl_data.
             _M_start + 1);
    bVar2 = ValidQAM((QAM *)local_198);
    if (bVar2) {
      std::__cxx11::string::~string((string *)(local_198 + 0x10));
LAB_0010bff5:
      std::__cxx11::string::string((string *)&local_260,"one_over_2p",&local_261);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)__return_storage_ptr__,&local_260);
      std::__cxx11::string::~string((string *)&local_260);
      std::__cxx11::string::string((string *)&local_260,"a_over_p",&local_261);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)__return_storage_ptr__,&local_260);
      std::__cxx11::string::~string((string *)&local_260);
    }
    else {
      QAM::QAM((QAM *)local_a8,
               amreq.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.super__Vector_impl_data.
               _M_start + 2);
      bVar2 = ValidQAM((QAM *)local_a8);
      std::__cxx11::string::~string((string *)(local_a8 + 0x10));
      std::__cxx11::string::~string((string *)(local_198 + 0x10));
      if (bVar2) goto LAB_0010bff5;
    }
    QAM::QAM((QAM *)local_1c8,
             amreq.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.super__Vector_impl_data.
             _M_start + 3);
    bVar2 = ValidQAM((QAM *)local_1c8);
    if (bVar2) {
      std::__cxx11::string::~string((string *)(local_1c8 + 0x10));
    }
    else {
      QAM::QAM((QAM *)local_d8,
               amreq.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.super__Vector_impl_data.
               _M_start + 4);
      bVar2 = ValidQAM((QAM *)local_d8);
      std::__cxx11::string::~string((string *)(local_d8 + 0x10));
      std::__cxx11::string::~string((string *)(local_1c8 + 0x10));
      if (!bVar2) goto LAB_0010c0f8;
    }
    std::__cxx11::string::string((string *)&local_260,"one_over_2pq",&local_261);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)__return_storage_ptr__,&local_260);
  }
  else {
    QAM::QAM((QAM *)local_108,
             amreq.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.super__Vector_impl_data.
             _M_start);
    bVar2 = ValidQAM((QAM *)local_108);
    std::__cxx11::string::~string((string *)(local_108 + 0x10));
    if (bVar2) {
      if (rrstep == K) {
        std::__cxx11::string::string((string *)&local_260,"Q_PA",&local_261);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)__return_storage_ptr__,&local_260);
      }
      else {
        std::__cxx11::string::string((string *)&local_260,"Q_PB",&local_261);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)__return_storage_ptr__,&local_260);
      }
      std::__cxx11::string::~string((string *)&local_260);
      std::__cxx11::string::string((string *)&local_260,"aoq_PQ",&local_261);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)__return_storage_ptr__,&local_260);
      std::__cxx11::string::~string((string *)&local_260);
    }
    QAM::QAM((QAM *)local_1f8,
             amreq.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.super__Vector_impl_data.
             _M_start + 1);
    bVar2 = ValidQAM((QAM *)local_1f8);
    if (bVar2) {
      std::__cxx11::string::~string((string *)(local_1f8 + 0x10));
LAB_0010be2b:
      std::__cxx11::string::string((string *)&local_260,"one_over_2q",&local_261);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)__return_storage_ptr__,&local_260);
      std::__cxx11::string::~string((string *)&local_260);
      std::__cxx11::string::string((string *)&local_260,"a_over_q",&local_261);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)__return_storage_ptr__,&local_260);
      std::__cxx11::string::~string((string *)&local_260);
    }
    else {
      QAM::QAM((QAM *)local_138,
               amreq.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.super__Vector_impl_data.
               _M_start + 2);
      bVar2 = ValidQAM((QAM *)local_138);
      std::__cxx11::string::~string((string *)(local_138 + 0x10));
      std::__cxx11::string::~string((string *)(local_1f8 + 0x10));
      if (bVar2) goto LAB_0010be2b;
    }
    QAM::QAM((QAM *)local_228,
             amreq.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.super__Vector_impl_data.
             _M_start + 3);
    bVar2 = ValidQAM((QAM *)local_228);
    if (bVar2) {
      std::__cxx11::string::~string((string *)(local_228 + 0x10));
    }
    else {
      QAM::QAM((QAM *)local_168,
               amreq.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.super__Vector_impl_data.
               _M_start + 4);
      bVar2 = ValidQAM((QAM *)local_168);
      std::__cxx11::string::~string((string *)(local_168 + 0x10));
      std::__cxx11::string::~string((string *)(local_228 + 0x10));
      if (!bVar2) goto LAB_0010c0f8;
    }
    std::__cxx11::string::string((string *)&local_260,"one_over_2pq",&local_261);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)__return_storage_ptr__,&local_260);
  }
  std::__cxx11::string::~string((string *)&local_260);
LAB_0010c0f8:
  std::vector<QAM,_std::allocator<QAM>_>::~vector(&amreq);
  return __return_storage_ptr__;
}

Assistant:

StringSet OSTEI_VRR_Algorithm_Base::GenerateVarReq(QAM am, RRStepType rrstep) const
{
    auto amreq = GenerateAMReq(am, rrstep, true);

    StringSet req;


    if(rrstep == RRStepType::I || rrstep == RRStepType::J)
    {
        if(ValidQAM(amreq[0]))
        {
            if(rrstep == RRStepType::I)
                req.insert("P_PA");
            else
                req.insert("P_PB");

            req.insert("aop_PQ");
        }

        if(ValidQAM(amreq[1]) || ValidQAM(amreq[2]))
        {
            req.insert("one_over_2p");
            req.insert("a_over_p");
        }

        if(ValidQAM(amreq[3]) || ValidQAM(amreq[4]))
            req.insert("one_over_2pq");
    }
    else
    {
        if(ValidQAM(amreq[0]))
        {
            if(rrstep == RRStepType::K)
                req.insert("Q_PA");
            else
                req.insert("Q_PB");

            req.insert("aoq_PQ");
        }

        if(ValidQAM(amreq[1]) || ValidQAM(amreq[2]))
        {
            req.insert("one_over_2q");
            req.insert("a_over_q");
        }

        if(ValidQAM(amreq[3]) || ValidQAM(amreq[4]))
            req.insert("one_over_2pq");
    }

    return req;

}